

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionObject.cpp
# Opt level: O2

aphy_matrix3x3 * __thiscall
APhyBullet::BulletCollisionObject::getMatrix
          (aphy_matrix3x3 *__return_storage_ptr__,BulletCollisionObject *this)

{
  convertMatrix(&(this->handle->m_worldTransform).m_basis);
  return __return_storage_ptr__;
}

Assistant:

aphy_matrix3x3 BulletCollisionObject::getMatrix()
{
    return convertMatrix(handle->getWorldTransform().getBasis());
}